

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O3

void __thiscall
PSVIWriterHandlers::processFacets
          (PSVIWriterHandlers *this,XSFacetList *facets,XSMultiValueFacetList *multiFacets)

{
  BaseRefVectorOf<char16_t> *this_00;
  bool bVar1;
  XSFacet *pXVar2;
  XMLCh *pXVar3;
  XSMultiValueFacet *pXVar4;
  char16_t *value;
  XMLSize_t XVar5;
  XMLSize_t getAt;
  PSVIWriterHandlers *pPVar6;
  ulong uVar7;
  
  if (facets == (XSFacetList *)0x0 && multiFacets == (XSMultiValueFacetList *)0x0) {
    sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacets);
    return;
  }
  writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacets);
  incIndent(this);
  if ((facets != (XSFacetList *)0x0) && (*(long *)(facets + 0x10) != 0)) {
    XVar5 = 0;
    uVar7 = 1;
    do {
      pPVar6 = (PSVIWriterHandlers *)facets;
      pXVar2 = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSFacet>::elementAt
                         ((BaseRefVectorOf<xercesc_4_0::XSFacet> *)facets,XVar5);
      pXVar3 = translateFacet(pPVar6,*(FACET *)(pXVar2 + 0x28));
      writeOpen(this,pXVar3);
      incIndent(this);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValue,*(XMLCh **)(pXVar2 + 0x30));
      pXVar3 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
      if (pXVar2[0x2c] != (XSFacet)0x0) {
        pXVar3 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
      }
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacetFixed,pXVar3);
      pPVar6 = this;
      processAnnotation(this,*(XSAnnotation **)(pXVar2 + 0x38));
      pXVar3 = translateFacet(pPVar6,*(FACET *)(pXVar2 + 0x28));
      sendUnindentedElement(this,pXVar3);
      bVar1 = uVar7 < *(ulong *)(facets + 0x10);
      XVar5 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar1);
  }
  if ((multiFacets != (XSMultiValueFacetList *)0x0) && (*(long *)(multiFacets + 0x10) != 0)) {
    XVar5 = 0;
    do {
      pPVar6 = (PSVIWriterHandlers *)multiFacets;
      pXVar4 = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::elementAt
                         ((BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)multiFacets,XVar5);
      pXVar3 = translateFacet(pPVar6,*(FACET *)(pXVar4 + 0x28));
      writeOpen(this,pXVar3);
      incIndent(this);
      this_00 = *(BaseRefVectorOf<char16_t> **)(pXVar4 + 0x30);
      if (this_00->fCurCount != 0) {
        getAt = 0;
        uVar7 = 1;
        do {
          value = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(this_00,getAt);
          sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValue,value);
          bVar1 = uVar7 < this_00->fCurCount;
          getAt = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (bVar1);
      }
      pXVar3 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
      if (pXVar4[0x2c] != (XSMultiValueFacet)0x0) {
        pXVar3 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
      }
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacetFixed,pXVar3);
      pPVar6 = this;
      processAnnotations(this,*(XSAnnotationList **)(pXVar4 + 0x38));
      pXVar3 = translateFacet(pPVar6,*(FACET *)(pXVar4 + 0x28));
      sendUnindentedElement(this,pXVar3);
      XVar5 = (XMLSize_t)((int)XVar5 + 1);
    } while (XVar5 < *(ulong *)(multiFacets + 0x10));
  }
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacets);
  return;
}

Assistant:

void PSVIWriterHandlers::processFacets(XSFacetList* facets, XSMultiValueFacetList* multiFacets) {
	if (facets == NULL && multiFacets == NULL) {
		sendElementEmpty(PSVIUni::fgFacets);
	} else {
		sendIndentedElement(PSVIUni::fgFacets);
		if (facets != NULL) {
			for (unsigned int facetCount = 0; facetCount < facets->size(); facetCount++) {
				XSFacet* facet = facets->elementAt(facetCount);
				sendIndentedElement(translateFacet(facet->getFacetKind()));
				sendElementValue(PSVIUni::fgValue, facet->getLexicalFacetValue());
				sendElementValue(PSVIUni::fgFacetFixed, translateBool(facet->isFixed()));
				processAnnotation(facet->getAnnotation());
				sendUnindentedElement(translateFacet(facet->getFacetKind()));
			}
		}
		if (multiFacets != NULL) {
			for (unsigned int multiFacetCount = 0; multiFacetCount < multiFacets->size(); multiFacetCount++) {
				XSMultiValueFacet* multiFacet = multiFacets->elementAt(multiFacetCount);
				sendIndentedElement(translateFacet(multiFacet->getFacetKind()));
				StringList* values = multiFacet->getLexicalFacetValues();
				for (unsigned int i=0; i < values->size(); i++) {
					sendElementValue(PSVIUni::fgValue, values->elementAt(i));
				}
				sendElementValue(PSVIUni::fgFacetFixed, translateBool(multiFacet->isFixed()));
				processAnnotations(multiFacet->getAnnotations());
				sendUnindentedElement(translateFacet(multiFacet->getFacetKind()));
			}
		}
		sendUnindentedElement(PSVIUni::fgFacets);
	}
}